

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmState *this_01;
  char *val;
  LinkType LVar3;
  allocator local_d9;
  string local_d8;
  char *local_b8;
  char *lss;
  undefined1 local_a8 [8];
  string shared_link_type_flag_var;
  undefined1 local_80 [8];
  string static_link_type_flag_var;
  char *target_type_str;
  char *shared_link_type_flag;
  char *static_link_type_flag;
  allocator local_31;
  string local_30;
  cmComputeLinkInformation *local_10;
  cmComputeLinkInformation *this_local;
  
  local_10 = this;
  this_01 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS",&local_31);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_01,&local_30);
  this->ArchivesMayBeShared = bVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this->LinkTypeEnabled = false;
  shared_link_type_flag = (char *)0x0;
  target_type_str = (char *)0x0;
  static_link_type_flag_var.field_2._8_8_ = 0;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    static_link_type_flag_var.field_2._8_8_ = (long)"CMAKE_CREATE_WIN32_EXE" + 0x13;
  }
  else if (TVar2 == SHARED_LIBRARY) {
    static_link_type_flag_var.field_2._8_8_ = (long)"_CREATE_SHARED_LIBRARY" + 8;
  }
  else if (TVar2 == MODULE_LIBRARY) {
    static_link_type_flag_var.field_2._8_8_ = (long)"_CREATE_SHARED_MODULE" + 8;
  }
  if (static_link_type_flag_var.field_2._8_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_80,"CMAKE_",
               (allocator *)(shared_link_type_flag_var.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(shared_link_type_flag_var.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=
              ((string *)local_80,(char *)static_link_type_flag_var.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_80,"_LINK_STATIC_");
    std::__cxx11::string::operator+=((string *)local_80,(string *)&this->LinkLanguage);
    std::__cxx11::string::operator+=((string *)local_80,"_FLAGS");
    shared_link_type_flag = cmMakefile::GetDefinition(this->Makefile,(string *)local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,"CMAKE_",(allocator *)((long)&lss + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&lss + 7));
    std::__cxx11::string::operator+=
              ((string *)local_a8,(char *)static_link_type_flag_var.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_a8,"_LINK_DYNAMIC_");
    std::__cxx11::string::operator+=((string *)local_a8,(string *)&this->LinkLanguage);
    std::__cxx11::string::operator+=((string *)local_a8,"_FLAGS");
    target_type_str = cmMakefile::GetDefinition(this->Makefile,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_80);
  }
  if ((((shared_link_type_flag != (char *)0x0) && (*shared_link_type_flag != '\0')) &&
      (target_type_str != (char *)0x0)) && (*target_type_str != '\0')) {
    this->LinkTypeEnabled = true;
    std::__cxx11::string::operator=((string *)&this->StaticLinkTypeFlag,shared_link_type_flag);
    std::__cxx11::string::operator=((string *)&this->SharedLinkTypeFlag,target_type_str);
  }
  this_00 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"LINK_SEARCH_START_STATIC",&local_d9);
  val = cmGeneratorTarget::GetProperty(this_00,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  local_b8 = val;
  bVar1 = cmSystemTools::IsOn(val);
  LVar3 = LinkShared;
  if (bVar1) {
    LVar3 = LinkStatic;
  }
  this->StartLinkType = LVar3;
  this->CurrentLinkType = this->StartLinkType;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  const char* static_link_type_flag = CM_NULLPTR;
  const char* shared_link_type_flag = CM_NULLPTR;
  const char* target_type_str = CM_NULLPTR;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var = "CMAKE_";
    static_link_type_flag_var += target_type_str;
    static_link_type_flag_var += "_LINK_STATIC_";
    static_link_type_flag_var += this->LinkLanguage;
    static_link_type_flag_var += "_FLAGS";
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var = "CMAKE_";
    shared_link_type_flag_var += target_type_str;
    shared_link_type_flag_var += "_LINK_DYNAMIC_";
    shared_link_type_flag_var += this->LinkLanguage;
    shared_link_type_flag_var += "_FLAGS";
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (static_link_type_flag && *static_link_type_flag &&
      shared_link_type_flag && *shared_link_type_flag) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = static_link_type_flag;
    this->SharedLinkTypeFlag = shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  const char* lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = cmSystemTools::IsOn(lss) ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}